

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

int cmsys::anon_unknown_3::GetFieldFromFile<long_long>
              (char *fileName,char *fieldName,longlong *value)

{
  longlong lStack_40;
  int ierr;
  longlong values [1];
  char *fieldNames [2];
  longlong *value_local;
  char *fieldName_local;
  char *fileName_local;
  
  values[0] = (longlong)fieldName;
  memset(&stack0xffffffffffffffc0,0,8);
  fileName_local._4_4_ =
       GetFieldsFromFile<long_long>(fileName,(char **)values,&stack0xffffffffffffffc0);
  if (fileName_local._4_4_ == 0) {
    *value = lStack_40;
    fileName_local._4_4_ = 0;
  }
  return fileName_local._4_4_;
}

Assistant:

int GetFieldFromFile(const char* fileName, const char* fieldName, T& value)
{
  const char* fieldNames[2] = { fieldName, nullptr };
  T values[1] = { T(0) };
  int ierr = GetFieldsFromFile(fileName, fieldNames, values);
  if (ierr) {
    return ierr;
  }
  value = values[0];
  return 0;
}